

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_query_node.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::VisitQueryNode
          (Binder *this,BoundQueryNode *node,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  ResultModifierType RVar1;
  pointer pBVar2;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var5;
  _Alloc_hider _Var6;
  pointer pBVar7;
  BoundDistinctModifier *pBVar8;
  pointer this_00;
  BoundOrderModifier *pBVar9;
  pointer pLVar10;
  LogicalDistinct *pLVar11;
  pointer pBVar12;
  BoundLimitModifier *pBVar13;
  pointer this_01;
  pointer this_02;
  BinderException *this_03;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  pointer this_04;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var14;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> this_05;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> local_90;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_88;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_80;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_78;
  string local_70;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_50;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> local_48;
  LogicalDistinct *local_40;
  LogicalOperator *local_38;
  
  this_05._M_head_impl =
       root[2].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  _Var14._M_head_impl =
       root[3].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_50 = in_RCX;
  local_48._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
       (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)this;
  local_38 = _Var14._M_head_impl;
  do {
    if (this_05._M_head_impl == _Var14._M_head_impl) {
      *(LogicalOperator **)
       local_48._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (in_RCX->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RCX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              )local_48._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    }
    pBVar7 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
             ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                           *)this_05._M_head_impl);
    RVar1 = pBVar7->type;
    if (RVar1 == LIMIT_MODIFIER) {
      pBVar7 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
               ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                             *)this_05._M_head_impl);
      pBVar13 = BoundResultModifier::Cast<duckdb::BoundLimitModifier>(pBVar7);
      make_uniq<duckdb::LogicalLimit,duckdb::BoundLimitNode,duckdb::BoundLimitNode>
                ((duckdb *)&local_70,&pBVar13->limit_val,&pBVar13->offset_val);
      this_01 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>::
                operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                            *)&local_70);
      local_88._M_head_impl =
           (in_RCX->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RCX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      LogicalOperator::AddChild
                (&this_01->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_88);
      if (local_88._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_88._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_88._M_head_impl = (LogicalOperator *)0x0;
LAB_01a7f73b:
      _Var6._M_p = local_70._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)0x0;
      _Var4._M_head_impl =
           (in_RCX->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RCX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)_Var6._M_p;
      if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var4._M_head_impl)->_vptr_LogicalOperator + 8))();
        if ((LogicalOperator *)local_70._M_dataplus._M_p != (LogicalOperator *)0x0) {
          (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
        }
      }
    }
    else {
      if (RVar1 == ORDER_MODIFIER) {
        pBVar7 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                 ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                               *)this_05._M_head_impl);
        pBVar9 = BoundResultModifier::Cast<duckdb::BoundOrderModifier>(pBVar7);
        pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->(in_RCX);
        if (pLVar10->type == LOGICAL_DISTINCT) {
          pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    ::operator->(local_50);
          pLVar11 = LogicalOperator::Cast<duckdb::LogicalDistinct>(pLVar10);
          if ((pLVar11->super_LogicalOperator).field_0x61 == '\x01') {
            local_40 = pLVar11;
            make_uniq<duckdb::BoundOrderModifier>();
            pBVar2 = (pBVar9->orders).
                     super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     .
                     super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (this_04 = (pBVar9->orders).
                           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                           .
                           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                _Var5._M_head_impl = local_90._M_head_impl, this_04 != pBVar2; this_04 = this_04 + 1
                ) {
              pBVar12 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                        ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                                      *)&local_90);
              BoundOrderByNode::Copy((BoundOrderByNode *)&local_70,this_04);
              ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
              emplace_back<duckdb::BoundOrderByNode>
                        (&(pBVar12->orders).
                          super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         ,(BoundOrderByNode *)&local_70);
              BoundOrderByNode::~BoundOrderByNode((BoundOrderByNode *)&local_70);
            }
            local_90._M_head_impl = (BoundOrderModifier *)0x0;
            _Var3._M_head_impl =
                 (local_40->order_by).
                 super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
                 .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
            (local_40->order_by).
            super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
            .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
                 _Var5._M_head_impl;
            if (_Var3._M_head_impl != (BoundOrderModifier *)0x0) {
              (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BoundResultModifier + 8))();
              if (local_90._M_head_impl != (BoundOrderModifier *)0x0) {
                (*((local_90._M_head_impl)->super_BoundResultModifier)._vptr_BoundResultModifier[1])
                          ();
              }
            }
          }
        }
        make_uniq<duckdb::LogicalOrder,duckdb::vector<duckdb::BoundOrderByNode,true>>
                  ((duckdb *)&local_70,&pBVar9->orders);
        this_02 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                *)&local_70);
        in_RCX = local_50;
        local_80._M_head_impl =
             (local_50->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (local_50->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  (&this_02->super_LogicalOperator,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_80);
        _Var14._M_head_impl = local_38;
        if (local_80._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_80._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_80._M_head_impl = (LogicalOperator *)0x0;
        goto LAB_01a7f73b;
      }
      if (RVar1 != DISTINCT_MODIFIER) {
        this_03 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_70,"Unimplemented modifier type!",(allocator *)&local_90);
        BinderException::BinderException(this_03,&local_70);
        __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pBVar7 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
               ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                             *)this_05._M_head_impl);
      pBVar8 = BoundResultModifier::Cast<duckdb::BoundDistinctModifier>(pBVar7);
      if ((pBVar8->target_distincts).
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pBVar8->target_distincts).
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        make_uniq<duckdb::LogicalDistinct,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::DistinctType&>
                  ((duckdb *)&local_70,&pBVar8->target_distincts,
                   &(pBVar8->super_BoundResultModifier).field_0x9);
        this_00 = unique_ptr<duckdb::LogicalDistinct,_std::default_delete<duckdb::LogicalDistinct>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDistinct,_std::default_delete<duckdb::LogicalDistinct>,_true>
                                *)&local_70);
        local_78._M_head_impl =
             (in_RCX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RCX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  (&this_00->super_LogicalOperator,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_78);
        if (local_78._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_78._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_78._M_head_impl = (LogicalOperator *)0x0;
        goto LAB_01a7f73b;
      }
    }
    this_05._M_head_impl = (LogicalOperator *)&(this_05._M_head_impl)->type;
  } while( true );
}

Assistant:

unique_ptr<LogicalOperator> Binder::VisitQueryNode(BoundQueryNode &node, unique_ptr<LogicalOperator> root) {
	D_ASSERT(root);
	for (auto &mod : node.modifiers) {
		switch (mod->type) {
		case ResultModifierType::DISTINCT_MODIFIER: {
			auto &bound = mod->Cast<BoundDistinctModifier>();
			if (bound.target_distincts.empty()) {
				break;
			}
			auto distinct = make_uniq<LogicalDistinct>(std::move(bound.target_distincts), bound.distinct_type);
			distinct->AddChild(std::move(root));
			root = std::move(distinct);
			break;
		}
		case ResultModifierType::ORDER_MODIFIER: {
			auto &bound = mod->Cast<BoundOrderModifier>();
			if (root->type == LogicalOperatorType::LOGICAL_DISTINCT) {
				auto &distinct = root->Cast<LogicalDistinct>();
				if (distinct.distinct_type == DistinctType::DISTINCT_ON) {
					auto order_by = make_uniq<BoundOrderModifier>();
					for (auto &order_node : bound.orders) {
						order_by->orders.push_back(order_node.Copy());
					}
					distinct.order_by = std::move(order_by);
				}
			}
			auto order = make_uniq<LogicalOrder>(std::move(bound.orders));
			order->AddChild(std::move(root));
			root = std::move(order);
			break;
		}
		case ResultModifierType::LIMIT_MODIFIER: {
			auto &bound = mod->Cast<BoundLimitModifier>();
			auto limit = make_uniq<LogicalLimit>(std::move(bound.limit_val), std::move(bound.offset_val));
			limit->AddChild(std::move(root));
			root = std::move(limit);
			break;
		}
		default:
			throw BinderException("Unimplemented modifier type!");
		}
	}
	return root;
}